

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavMoveRequestForward
               (ImGuiDir move_dir,ImGuiDir clip_dir,ImRect *bb_rel,ImGuiNavMoveFlags move_flags)

{
  ImGuiContext *pIVar1;
  ImVec2 *pIVar2;
  ImGuiContext *g;
  ImGuiNavMoveFlags move_flags_local;
  ImRect *bb_rel_local;
  ImGuiDir clip_dir_local;
  ImGuiDir move_dir_local;
  
  pIVar1 = GImGui;
  if (GImGui->NavMoveRequestForward == ImGuiNavForward_None) {
    NavMoveRequestCancel();
    pIVar1->NavMoveDir = move_dir;
    pIVar1->NavMoveClipDir = clip_dir;
    pIVar1->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
    pIVar1->NavMoveRequestFlags = move_flags;
    pIVar2 = &pIVar1->NavWindow->NavRectRel[pIVar1->NavLayer].Min;
    *pIVar2 = bb_rel->Min;
    pIVar2[1] = bb_rel->Max;
    return;
  }
  __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_None",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                ,0x1fb2,
                "void ImGui::NavMoveRequestForward(ImGuiDir, ImGuiDir, const ImRect &, ImGuiNavMoveFlags)"
               );
}

Assistant:

void ImGui::NavMoveRequestForward(ImGuiDir move_dir, ImGuiDir clip_dir, const ImRect& bb_rel, ImGuiNavMoveFlags move_flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavMoveRequestForward == ImGuiNavForward_None);
    NavMoveRequestCancel();
    g.NavMoveDir = move_dir;
    g.NavMoveClipDir = clip_dir;
    g.NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
    g.NavMoveRequestFlags = move_flags;
    g.NavWindow->NavRectRel[g.NavLayer] = bb_rel;
}